

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  int *__s;
  int *__s_00;
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  int *__s_01;
  unsigned_short *puVar9;
  uchar *puVar10;
  uint *puVar11;
  uint *puVar12;
  uint *frequencies;
  uint *puVar13;
  void *__dest;
  void *__ptr;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  size_t sVar24;
  long lVar25;
  size_t sVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  size_t sVar32;
  uint *puVar33;
  LodePNGBitWriter local_168;
  uivector lz77_encoded;
  ucvector v;
  HuffmanTree tree_ll;
  HuffmanTree local_c8;
  HuffmanTree tree_d;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_168.data = &v;
  local_168.bp = '\0';
  uVar19 = settings->btype;
  uVar6 = 0x3d;
  if (uVar19 < 3) {
    sVar24 = insize;
    v.allocsize = v.size;
    if (uVar19 != 1) {
      if (uVar19 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar6 = 0;
        }
        else {
          uVar31 = (insize + 0xfffe) / 0xffff;
          uVar19 = 0;
          do {
            sVar24 = v.size;
            uVar6 = (int)insize - uVar19;
            if (0xfffe < insize - uVar19) {
              uVar6 = 0xffff;
            }
            uVar20 = (ulong)uVar6;
            uVar29 = uVar20 + v.size + 5;
            puVar10 = v.data;
            sVar26 = v.allocsize;
            if (v.allocsize < uVar29) {
              sVar26 = (v.allocsize >> 1) + uVar29;
              puVar10 = (uchar *)realloc(v.data,sVar26);
              if (puVar10 != (uchar *)0x0) goto LAB_00108462;
              bVar3 = true;
            }
            else {
LAB_00108462:
              v.allocsize = sVar26;
              v.data = puVar10;
              bVar3 = false;
              v.size = uVar29;
            }
            if (!bVar3) {
              v.data[sVar24] = uVar31 == 1;
              v.data[sVar24 + 1] = (uchar)uVar6;
              v.data[sVar24 + 2] = (uchar)(uVar6 >> 8);
              v.data[sVar24 + 3] = (uchar)(0xffff - uVar6);
              v.data[sVar24 + 4] = (uchar)(0xffff - uVar6 >> 8);
              if (uVar20 != 0) {
                memcpy(v.data + sVar24 + 5,in + uVar19,uVar20);
              }
              uVar19 = uVar6 + uVar19;
            }
            if (bVar3) {
              uVar6 = 0x53;
              goto LAB_001090ad;
            }
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
          uVar6 = 0;
        }
        goto LAB_001090ad;
      }
      uVar31 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar31 = insize >> 3;
      }
      if (0x3fff7 < uVar31) {
        uVar31 = 0x3fff8;
      }
      sVar24 = uVar31 + 8;
    }
    uVar31 = 1;
    if (!CARRY8(insize - 1,sVar24)) {
      uVar31 = ((insize - 1) + sVar24) / sVar24;
    }
    uVar20 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    hash.head = __s;
    __s_00 = (int *)malloc(uVar20 * 4);
    sVar32 = uVar20 * 2;
    hash.val = __s_00;
    puVar7 = (unsigned_short *)malloc(sVar32);
    hash.chain = puVar7;
    puVar8 = (unsigned_short *)malloc(sVar32);
    hash.zeros = puVar8;
    __s_01 = (int *)malloc(0x40c);
    hash.headz = __s_01;
    puVar9 = (unsigned_short *)malloc(sVar32);
    uVar6 = 0x53;
    hash.chainz = puVar9;
    if (__s_00 == (int *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      if ((((__s != (int *)0x0) && (puVar7 != (unsigned_short *)0x0)) &&
          (bVar3 = false, puVar8 != (unsigned_short *)0x0)) &&
         ((__s_01 != (int *)0x0 && (puVar9 != (unsigned_short *)0x0)))) {
        memset(__s,0xff,0x40000);
        if (uVar20 == 0) {
          memset(__s_01,0xff,0x40c);
        }
        else {
          memset(__s_00,0xff,uVar20 * 4);
          uVar29 = 0;
          do {
            puVar7[uVar29] = (unsigned_short)uVar29;
            uVar29 = uVar29 + 1;
          } while (uVar20 != uVar29);
          memset(__s_01,0xff,0x40c);
          uVar29 = 0;
          do {
            puVar9[uVar29] = (unsigned_short)uVar29;
            uVar29 = uVar29 + 1;
          } while (uVar20 != uVar29);
        }
        uVar6 = 0;
        bVar3 = true;
      }
    }
    if (bVar3) {
      if (uVar31 == 0) {
        uVar6 = 0;
      }
      else {
        lVar27 = 0;
        uVar6 = 0;
        uVar29 = 0;
        puVar10 = in;
        uVar20 = sVar24;
        do {
          uVar16 = uVar20;
          if (insize < uVar20) {
            uVar16 = insize;
          }
          uVar30 = uVar29 * sVar24;
          uVar14 = sVar24 + uVar30;
          if (insize <= sVar24 + uVar30) {
            uVar14 = insize;
          }
          uVar19 = (uint)(uVar29 == uVar31 - 1);
          if (settings->btype == 2) {
            lz77_encoded.data = (uint *)0x0;
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            local_c8.codes = (uint *)0x0;
            local_c8.lengths = (uint *)0x0;
            local_c8.table_len = (uchar *)0x0;
            local_c8.table_value = (unsigned_short *)0x0;
            puVar11 = (uint *)malloc(0x478);
            puVar12 = (uint *)malloc(0x78);
            frequencies = (uint *)malloc(0x4c);
            if ((puVar12 == (uint *)0x0 || puVar11 == (uint *)0x0) || frequencies == (uint *)0x0) {
LAB_001088c1:
              uVar6 = 0x53;
              __ptr = (void *)0x0;
              __dest = (void *)0x0;
            }
            else {
              memset(puVar11,0,0x478);
              puVar12[0] = 0;
              puVar12[1] = 0;
              puVar12[2] = 0;
              puVar12[3] = 0;
              puVar12[4] = 0;
              puVar12[5] = 0;
              puVar12[6] = 0;
              puVar12[7] = 0;
              puVar12[8] = 0;
              puVar12[9] = 0;
              puVar12[10] = 0;
              puVar12[0xb] = 0;
              puVar12[0xc] = 0;
              puVar12[0xd] = 0;
              puVar12[0xe] = 0;
              puVar12[0xf] = 0;
              puVar12[0x10] = 0;
              puVar12[0x11] = 0;
              puVar12[0x12] = 0;
              puVar12[0x13] = 0;
              puVar12[0x14] = 0;
              puVar12[0x15] = 0;
              puVar12[0x16] = 0;
              puVar12[0x17] = 0;
              puVar12[0x18] = 0;
              puVar12[0x19] = 0;
              puVar12[0x1a] = 0;
              puVar12[0x1b] = 0;
              puVar12[0x1c] = 0;
              puVar12[0x1d] = 0;
              frequencies[0xf] = 0;
              frequencies[0x10] = 0;
              frequencies[0x11] = 0;
              frequencies[0x12] = 0;
              frequencies[0xc] = 0;
              frequencies[0xd] = 0;
              frequencies[0xe] = 0;
              frequencies[0xf] = 0;
              frequencies[8] = 0;
              frequencies[9] = 0;
              frequencies[10] = 0;
              frequencies[0xb] = 0;
              frequencies[4] = 0;
              frequencies[5] = 0;
              frequencies[6] = 0;
              frequencies[7] = 0;
              frequencies[0] = 0;
              frequencies[1] = 0;
              frequencies[2] = 0;
              frequencies[3] = 0;
              if (settings->use_lz77 == 0) {
                sVar26 = uVar14 - uVar30;
                uVar15 = sVar26 * 4;
                puVar13 = lz77_encoded.data;
                if (lz77_encoded.allocsize <= uVar15 && uVar15 - lz77_encoded.allocsize != 0) {
                  sVar32 = (lz77_encoded.allocsize >> 1) + uVar15;
                  puVar13 = (uint *)realloc(lz77_encoded.data,sVar32);
                  lz77_encoded.allocsize = sVar32;
                  if (puVar13 == (uint *)0x0) goto LAB_001088c1;
                }
                lz77_encoded.data = puVar13;
                lz77_encoded.size = sVar26;
                if (uVar30 < uVar14) {
                  lVar21 = 0;
                  do {
                    lz77_encoded.data[lVar21] = (uint)puVar10[lVar21];
                    lVar21 = lVar21 + 1;
                  } while (uVar16 + lVar27 != lVar21);
                }
              }
              else {
                uVar6 = encodeLZ77(&lz77_encoded,&hash,in,uVar30,uVar14,settings->windowsize,
                                   settings->minmatch,settings->nicematch,settings->lazymatching);
                if (uVar6 != 0) {
                  __ptr = (void *)0x0;
                  __dest = (void *)0x0;
                  goto LAB_001089f3;
                }
              }
              if (lz77_encoded.size != 0) {
                sVar26 = 0;
                do {
                  uVar6 = lz77_encoded.data[sVar26];
                  puVar11[uVar6] = puVar11[uVar6] + 1;
                  if (0x100 < (ulong)uVar6) {
                    puVar12[lz77_encoded.data[sVar26 + 2]] =
                         puVar12[lz77_encoded.data[sVar26 + 2]] + 1;
                    sVar26 = sVar26 + 3;
                  }
                  sVar26 = sVar26 + 1;
                } while (sVar26 != lz77_encoded.size);
              }
              puVar11[0x100] = 1;
              uVar6 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar11,0x101,0x11e,0xf);
              if ((uVar6 == 0) &&
                 (uVar6 = HuffmanTree_makeFromFrequencies(&tree_d,puVar12,2,0x1e,0xf),
                 uVar5 = tree_d.numcodes, uVar22 = tree_ll.numcodes, uVar6 == 0)) {
                uVar16 = 0x11e;
                if (tree_ll.numcodes < 0x11e) {
                  uVar16 = (ulong)tree_ll.numcodes;
                }
                uVar14 = 0x1e;
                if (tree_d.numcodes < 0x1e) {
                  uVar14 = (ulong)tree_d.numcodes;
                }
                uVar30 = uVar14 + uVar16;
                uVar15 = (ulong)(uint)((int)uVar30 * 4);
                __dest = malloc(uVar15);
                __ptr = malloc(uVar15);
                if (__ptr == (void *)0x0 || __dest == (void *)0x0) {
                  uVar6 = 0x53;
                }
                else {
                  if (uVar22 != 0) {
                    memcpy(__dest,tree_ll.lengths,uVar16 * 4);
                  }
                  if (uVar5 != 0) {
                    memcpy((void *)((long)__dest + uVar16 * 4),tree_d.lengths,uVar14 * 4);
                  }
                  if (uVar30 == 0) {
                    lVar21 = 0;
                  }
                  else {
                    uVar15 = 0;
                    lVar18 = 0;
                    do {
                      uVar1 = uVar15 + 1;
                      uVar17 = 0;
                      if (uVar1 < uVar30) {
                        uVar17 = 0;
                        uVar23 = uVar1;
                        do {
                          if (*(int *)((long)__dest + uVar23 * 4) !=
                              *(int *)((long)__dest + uVar15 * 4)) break;
                          uVar17 = (ulong)((int)uVar17 + 1);
                          uVar23 = uVar1 + uVar17;
                        } while (uVar23 < uVar30);
                      }
                      iVar2 = *(int *)((long)__dest + uVar15 * 4);
                      uVar6 = (uint)uVar17;
                      if ((uVar6 < 2) || (iVar2 != 0)) {
                        if (2 < uVar6) {
                          *(int *)((long)__ptr + lVar18 * 4) = iVar2;
                          lVar21 = lVar18 + 1;
                          if (5 < uVar6) {
                            lVar28 = (long)__ptr + lVar18 * 4 + 8;
                            lVar25 = 0;
                            do {
                              *(undefined8 *)(lVar28 + -4) = 0x300000010;
                              lVar28 = lVar28 + 8;
                              lVar25 = lVar25 + -2;
                            } while ((ulong)(uint)((int)(uVar17 / 6) * 2) + lVar25 != 0);
                            lVar21 = lVar21 - lVar25;
                            lVar18 = lVar18 - lVar25;
                          }
                          uVar22 = uVar6 + (int)(uVar17 / 6) * -6;
                          if (uVar22 < 3) {
                            uVar6 = uVar6 - uVar22;
                          }
                          else {
                            *(undefined4 *)((long)__ptr + lVar21 * 4) = 0x10;
                            *(uint *)((long)__ptr + lVar18 * 4 + 8) = uVar22 - 3;
                            lVar21 = lVar18 + 3;
                          }
                          goto LAB_00108d98;
                        }
                        *(int *)((long)__ptr + lVar18 * 4) = iVar2;
                        lVar21 = lVar18 + 1;
                      }
                      else {
                        uVar22 = uVar6 + 1;
                        if (uVar22 < 0xb) {
                          *(undefined4 *)((long)__ptr + lVar18 * 4) = 0x11;
                          *(uint *)((long)__ptr + lVar18 * 4 + 4) = uVar6 - 2;
                        }
                        else {
                          if (0x89 < uVar22) {
                            uVar22 = 0x8a;
                          }
                          *(undefined4 *)((long)__ptr + lVar18 * 4) = 0x12;
                          *(uint *)((long)__ptr + lVar18 * 4 + 4) = uVar22 - 0xb;
                          uVar6 = uVar22 - 1;
                        }
                        lVar21 = lVar18 + 2;
LAB_00108d98:
                        uVar15 = uVar15 + uVar6;
                      }
                      uVar15 = uVar15 + 1;
                      lVar18 = lVar21;
                    } while (uVar15 != uVar30);
                  }
                  if (lVar21 != 0) {
                    lVar18 = 0;
                    do {
                      uVar30 = (ulong)*(uint *)((long)__ptr + lVar18 * 4);
                      frequencies[uVar30] = frequencies[uVar30] + 1;
                      lVar18 = (lVar18 - (ulong)(uVar30 < 0x10)) + 2;
                    } while (lVar18 != lVar21);
                  }
                  uVar6 = HuffmanTree_makeFromFrequencies(&local_c8,frequencies,0x13,0x13,7);
                  puVar13 = local_c8.lengths;
                  if (uVar6 == 0) {
                    uVar30 = 0x14;
                    lVar18 = 0x13;
                    do {
                      lVar28 = lVar18;
                      uVar15 = uVar30 - 1;
                      if (uVar15 < 5) {
                        uVar15 = 4;
                        break;
                      }
                      lVar25 = uVar30 * 4;
                      uVar30 = uVar15;
                      lVar18 = lVar28 + -1;
                    } while (local_c8.lengths[*(uint *)(&UNK_001178c8 + lVar25)] == 0);
                    writeBits(&local_168,uVar19,1);
                    writeBits(&local_168,0,1);
                    writeBits(&local_168,1,1);
                    writeBits(&local_168,(int)uVar16 - 0x101,5);
                    writeBits(&local_168,(int)uVar14 - 1,5);
                    writeBits(&local_168,(int)uVar15 - 4,4);
                    puVar33 = CLCL_ORDER;
                    do {
                      writeBits(&local_168,puVar13[*puVar33],3);
                      puVar4 = local_c8.codes;
                      puVar33 = puVar33 + 1;
                      lVar28 = lVar28 + -1;
                    } while (lVar28 != 0);
                    if (lVar21 != 0) {
                      lVar18 = 0;
                      do {
                        uVar19 = *(uint *)((long)__ptr + lVar18 * 4);
                        writeBitsReversed(&local_168,puVar4[uVar19],(ulong)puVar13[uVar19]);
                        if (uVar19 - 0x10 < 3) {
                          lVar28 = lVar18 * 4;
                          lVar18 = lVar18 + 1;
                          writeBits(&local_168,*(uint *)((long)__ptr + lVar28 + 4),
                                    *(size_t *)(&DAT_001179a0 + (ulong)(uVar19 - 0x10) * 8));
                        }
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != lVar21);
                    }
                    writeLZ77data(&local_168,&lz77_encoded,&tree_ll,&tree_d);
                    if ((ulong)tree_ll.lengths[0x100] == 0) {
                      uVar6 = 0x40;
                    }
                    else {
                      writeBitsReversed(&local_168,tree_ll.codes[0x100],
                                        (ulong)tree_ll.lengths[0x100]);
                      uVar6 = 0;
                    }
                  }
                }
              }
              else {
                __ptr = (void *)0x0;
                __dest = (void *)0x0;
              }
            }
LAB_001089f3:
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            free(lz77_encoded.data);
            lz77_encoded.data = (uint *)0x0;
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            HuffmanTree_cleanup(&local_c8);
            free(puVar11);
            free(puVar12);
            free(frequencies);
            free(__dest);
            free(__ptr);
          }
          else if (settings->btype == 1) {
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            uVar6 = generateFixedLitLenTree(&tree_ll);
            if (uVar6 == 0) {
              uVar6 = generateFixedDistanceTree(&tree_d);
            }
            if (uVar6 == 0) {
              writeBits(&local_168,uVar19,1);
              writeBits(&local_168,1,1);
              writeBits(&local_168,0,1);
              puVar12 = tree_ll.lengths;
              puVar11 = tree_ll.codes;
              if (settings->use_lz77 == 0) {
                uVar6 = 0;
                if (uVar30 < uVar14) {
                  lVar21 = 0;
                  do {
                    writeBitsReversed(&local_168,puVar11[puVar10[lVar21]],
                                      (ulong)puVar12[puVar10[lVar21]]);
                    lVar21 = lVar21 + 1;
                  } while (uVar16 + lVar27 != lVar21);
                  uVar6 = 0;
                }
              }
              else {
                local_c8.codes = (uint *)0x0;
                local_c8.lengths = (uint *)0x0;
                local_c8.maxbitlen = 0;
                local_c8.numcodes = 0;
                uVar6 = encodeLZ77((uivector *)&local_c8,&hash,in,uVar30,uVar14,settings->windowsize
                                   ,settings->minmatch,settings->nicematch,settings->lazymatching);
                if (uVar6 == 0) {
                  writeLZ77data(&local_168,(uivector *)&local_c8,&tree_ll,&tree_d);
                }
                local_c8.lengths = (uint *)0x0;
                local_c8.maxbitlen = 0;
                local_c8.numcodes = 0;
                free(local_c8.codes);
              }
              if (uVar6 == 0) {
                writeBitsReversed(&local_168,tree_ll.codes[0x100],(ulong)tree_ll.lengths[0x100]);
                uVar6 = 0;
              }
            }
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
          }
          uVar29 = uVar29 + 1;
          if (uVar29 == uVar31) break;
          uVar20 = uVar20 + sVar24;
          lVar27 = lVar27 - sVar24;
          puVar10 = puVar10 + sVar24;
        } while (uVar6 == 0);
      }
    }
    free(hash.head);
    free(hash.val);
    free(hash.chain);
    free(hash.zeros);
    free(hash.headz);
    free(hash.chainz);
  }
LAB_001090ad:
  *out = v.data;
  *outsize = v.size;
  return uVar6;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}